

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

bool __thiscall wasm::EffectAnalyzer::invalidates(EffectAnalyzer *this,EffectAnalyzer *other)

{
  bool bVar1;
  reference puVar2;
  size_type sVar3;
  reference pNVar4;
  size_type sVar5;
  byte local_ba;
  byte local_b9;
  undefined1 local_b0 [8];
  Name global_1;
  iterator __end2_3;
  iterator __begin2_3;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2_3;
  Name global;
  iterator __end2_2;
  iterator __begin2_2;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *__range2_2;
  iterator iStack_58;
  uint local_54;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  iterator iStack_38;
  uint local;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  EffectAnalyzer *other_local;
  EffectAnalyzer *this_local;
  
  bVar1 = transfersControlFlow(this);
  if (((((((((bVar1) && (bVar1 = hasSideEffects(other), bVar1)) ||
           ((bVar1 = transfersControlFlow(other), bVar1 && (bVar1 = hasSideEffects(this), bVar1))))
          || ((((this->writesMemory & 1U) != 0 || ((this->calls & 1U) != 0)) &&
              (bVar1 = accessesMemory(other), bVar1)))) ||
         ((((other->writesMemory & 1U) != 0 || ((other->calls & 1U) != 0)) &&
          (bVar1 = accessesMemory(this), bVar1)))) ||
        (((((this->writesTable & 1U) != 0 || ((this->calls & 1U) != 0)) &&
          (bVar1 = accessesTable(other), bVar1)) ||
         ((((other->writesTable & 1U) != 0 || ((other->calls & 1U) != 0)) &&
          (bVar1 = accessesTable(this), bVar1)))))) ||
       ((((this->writesStruct & 1U) != 0 || ((this->calls & 1U) != 0)) &&
        (bVar1 = accessesMutableStruct(other), bVar1)))) ||
      ((((other->writesStruct & 1U) != 0 || ((other->calls & 1U) != 0)) &&
       (bVar1 = accessesMutableStruct(this), bVar1)))) ||
     ((((((this->writesArray & 1U) != 0 || ((this->calls & 1U) != 0)) &&
        (bVar1 = accessesArray(other), bVar1)) ||
       ((((other->writesArray & 1U) != 0 || ((other->calls & 1U) != 0)) &&
        (bVar1 = accessesArray(this), bVar1)))) ||
      (((this->danglingPop & 1U) != 0 || ((other->danglingPop & 1U) != 0)))))) {
    return true;
  }
  if ((((this->isAtomic & 1U) != 0) && (bVar1 = accessesMemory(other), bVar1)) ||
     (((other->isAtomic & 1U) != 0 && (bVar1 = accessesMemory(this), bVar1)))) {
    return true;
  }
  __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (&this->localsWritten);
  iStack_38 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&this->localsWritten);
  while (bVar1 = std::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
    __range2_1._4_4_ = *puVar2;
    sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (&other->localsRead,(key_type *)((long)&__range2_1 + 4));
    if ((sVar3 != 0) ||
       (sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count(&other->localsWritten,(key_type *)((long)&__range2_1 + 4)), sVar3 != 0)) {
      return true;
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
  }
  __end2_1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (&this->localsRead);
  iStack_58 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (&this->localsRead);
  while (bVar1 = std::operator!=(&__end2_1,&stack0xffffffffffffffa8), bVar1) {
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2_1);
    __range2_2._4_4_ = *puVar2;
    sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (&other->localsWritten,(key_type *)((long)&__range2_2 + 4));
    if (sVar3 != 0) {
      return true;
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2_1);
  }
  if ((((other->calls & 1U) != 0) && (bVar1 = accessesMutableGlobal(this), bVar1)) ||
     (((this->calls & 1U) != 0 && (bVar1 = accessesMutableGlobal(other), bVar1)))) {
    return true;
  }
  __end2_2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       (&this->globalsWritten);
  global.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         (&this->globalsWritten);
  while (bVar1 = std::operator!=(&__end2_2,(_Self *)&global.super_IString.str._M_str), bVar1) {
    pNVar4 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2_2);
    __range2_3 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                 (pNVar4->super_IString).str._M_len;
    global.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
    sVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                      (&other->mutableGlobalsRead,(key_type *)&__range2_3);
    if ((sVar5 != 0) ||
       (sVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                          (&other->globalsWritten,(key_type *)&__range2_3), sVar5 != 0)) {
      return true;
    }
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2_2);
  }
  __end2_3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::begin
                       (&this->mutableGlobalsRead);
  global_1.super_IString.str._M_str =
       (char *)std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::end
                         (&this->mutableGlobalsRead);
  while (bVar1 = std::operator!=(&__end2_3,(_Self *)&global_1.super_IString.str._M_str), bVar1) {
    pNVar4 = std::_Rb_tree_const_iterator<wasm::Name>::operator*(&__end2_3);
    local_b0 = (undefined1  [8])(pNVar4->super_IString).str._M_len;
    global_1.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
    sVar5 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                      (&other->globalsWritten,(key_type *)local_b0);
    if (sVar5 != 0) {
      return true;
    }
    std::_Rb_tree_const_iterator<wasm::Name>::operator++(&__end2_3);
  }
  if ((((this->trap & 1U) != 0) && (bVar1 = transfersControlFlow(other), bVar1)) ||
     (((other->trap & 1U) != 0 && (bVar1 = transfersControlFlow(this), bVar1)))) {
    return true;
  }
  if ((this->trap & 1U) != 0) {
    bVar1 = throws(other);
    local_b9 = 1;
    if (bVar1) goto LAB_0022b474;
  }
  bVar1 = throws(this);
  local_ba = 0;
  if (bVar1) {
    local_ba = other->trap;
  }
  local_b9 = local_ba;
LAB_0022b474:
  if (((local_b9 ^ 0xff) & 1) != 0) {
    if ((((this->trap & 1U) != 0) && (bVar1 = writesGlobalState(other), bVar1)) ||
       (((other->trap & 1U) != 0 && (bVar1 = writesGlobalState(this), bVar1)))) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("!((trap && other.throws()) || (throws() && other.trap))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/effects.h"
                ,0x118,"bool wasm::EffectAnalyzer::invalidates(const EffectAnalyzer &)");
}

Assistant:

bool invalidates(const EffectAnalyzer& other) {
    if ((transfersControlFlow() && other.hasSideEffects()) ||
        (other.transfersControlFlow() && hasSideEffects()) ||
        ((writesMemory || calls) && other.accessesMemory()) ||
        ((other.writesMemory || other.calls) && accessesMemory()) ||
        ((writesTable || calls) && other.accessesTable()) ||
        ((other.writesTable || other.calls) && accessesTable()) ||
        ((writesStruct || calls) && other.accessesMutableStruct()) ||
        ((other.writesStruct || other.calls) && accessesMutableStruct()) ||
        ((writesArray || calls) && other.accessesArray()) ||
        ((other.writesArray || other.calls) && accessesArray()) ||
        (danglingPop || other.danglingPop)) {
      return true;
    }
    // All atomics are sequentially consistent for now, and ordered wrt other
    // memory references.
    if ((isAtomic && other.accessesMemory()) ||
        (other.isAtomic && accessesMemory())) {
      return true;
    }
    for (auto local : localsWritten) {
      if (other.localsRead.count(local) || other.localsWritten.count(local)) {
        return true;
      }
    }
    for (auto local : localsRead) {
      if (other.localsWritten.count(local)) {
        return true;
      }
    }
    if ((other.calls && accessesMutableGlobal()) ||
        (calls && other.accessesMutableGlobal())) {
      return true;
    }
    for (auto global : globalsWritten) {
      if (other.mutableGlobalsRead.count(global) ||
          other.globalsWritten.count(global)) {
        return true;
      }
    }
    for (auto global : mutableGlobalsRead) {
      if (other.globalsWritten.count(global)) {
        return true;
      }
    }
    // We are ok to reorder implicit traps, but not conditionalize them.
    if ((trap && other.transfersControlFlow()) ||
        (other.trap && transfersControlFlow())) {
      return true;
    }
    // Note that the above includes disallowing the reordering of a trap with an
    // exception (as an exception can transfer control flow inside the current
    // function, so transfersControlFlow would be true) - while we allow the
    // reordering of traps with each other, we do not reorder exceptions with
    // anything.
    assert(!((trap && other.throws()) || (throws() && other.trap)));
    // We can't reorder an implicit trap in a way that could alter what global
    // state is modified.
    if ((trap && other.writesGlobalState()) ||
        (other.trap && writesGlobalState())) {
      return true;
    }
    return false;
  }